

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O0

void __thiscall inja::LexerConfig::update_open_chars(LexerConfig *this)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  LexerConfig *this_local;
  
  ::std::__cxx11::string::operator=((string *)&this->open_chars,"");
  cVar1 = (char)this;
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->line_statement);
  lVar3 = ::std::__cxx11::string::find(cVar1 + -0x40,(ulong)(uint)(int)*pcVar2);
  if (lVar3 == -1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->line_statement);
    ::std::__cxx11::string::operator+=((string *)&this->open_chars,*pcVar2);
  }
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)this);
  lVar3 = ::std::__cxx11::string::find(cVar1 + -0x40,(ulong)(uint)(int)*pcVar2);
  if (lVar3 == -1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)this);
    ::std::__cxx11::string::operator+=((string *)&this->open_chars,*pcVar2);
  }
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->statement_open_no_lstrip);
  lVar3 = ::std::__cxx11::string::find(cVar1 + -0x40,(ulong)(uint)(int)*pcVar2);
  if (lVar3 == -1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->statement_open_no_lstrip);
    ::std::__cxx11::string::operator+=((string *)&this->open_chars,*pcVar2);
  }
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->statement_open_force_lstrip);
  lVar3 = ::std::__cxx11::string::find(cVar1 + -0x40,(ulong)(uint)(int)*pcVar2);
  if (lVar3 == -1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->statement_open_force_lstrip);
    ::std::__cxx11::string::operator+=((string *)&this->open_chars,*pcVar2);
  }
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->expression_open);
  lVar3 = ::std::__cxx11::string::find(cVar1 + -0x40,(ulong)(uint)(int)*pcVar2);
  if (lVar3 == -1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->expression_open);
    ::std::__cxx11::string::operator+=((string *)&this->open_chars,*pcVar2);
  }
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->expression_open_force_lstrip);
  lVar3 = ::std::__cxx11::string::find(cVar1 + -0x40,(ulong)(uint)(int)*pcVar2);
  if (lVar3 == -1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->expression_open_force_lstrip);
    ::std::__cxx11::string::operator+=((string *)&this->open_chars,*pcVar2);
  }
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->comment_open);
  lVar3 = ::std::__cxx11::string::find(cVar1 + -0x40,(ulong)(uint)(int)*pcVar2);
  if (lVar3 == -1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->comment_open);
    ::std::__cxx11::string::operator+=((string *)&this->open_chars,*pcVar2);
  }
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->comment_open_force_lstrip);
  lVar3 = ::std::__cxx11::string::find(cVar1 + -0x40,(ulong)(uint)(int)*pcVar2);
  if (lVar3 == -1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&this->comment_open_force_lstrip);
    ::std::__cxx11::string::operator+=((string *)&this->open_chars,*pcVar2);
  }
  return;
}

Assistant:

void update_open_chars() {
    open_chars = "";
    if (open_chars.find(line_statement[0]) == std::string::npos) {
      open_chars += line_statement[0];
    }
    if (open_chars.find(statement_open[0]) == std::string::npos) {
      open_chars += statement_open[0];
    }
    if (open_chars.find(statement_open_no_lstrip[0]) == std::string::npos) {
      open_chars += statement_open_no_lstrip[0];
    }
    if (open_chars.find(statement_open_force_lstrip[0]) == std::string::npos) {
      open_chars += statement_open_force_lstrip[0];
    }
    if (open_chars.find(expression_open[0]) == std::string::npos) {
      open_chars += expression_open[0];
    }
    if (open_chars.find(expression_open_force_lstrip[0]) == std::string::npos) {
      open_chars += expression_open_force_lstrip[0];
    }
    if (open_chars.find(comment_open[0]) == std::string::npos) {
      open_chars += comment_open[0];
    }
    if (open_chars.find(comment_open_force_lstrip[0]) == std::string::npos) {
      open_chars += comment_open_force_lstrip[0];
    }
  }